

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

StringPtr capnp::compiler::getExpressionTargetName(Reader exp)

{
  ArrayPtr<const_char> AVar1;
  Reader exp_00;
  WirePointer *pWVar2;
  bool bVar3;
  ArrayPtr<const_char> AVar4;
  undefined8 unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined2 *in_stack_00000018;
  WirePointer *in_stack_00000020;
  uint in_stack_00000028;
  ushort in_stack_0000002c;
  undefined2 in_stack_0000002e;
  int in_stack_00000030;
  StructReader local_98;
  PointerReader local_68;
  StructReader local_48;
  
  AVar4.size_ = 1;
  AVar4.ptr = "";
  AVar1.size_ = 1;
  AVar1.ptr = "";
  if (in_stack_00000028 < 0x10) {
    return (StringPtr)AVar1;
  }
  switch(*in_stack_00000018) {
  case 5:
  case 0xb:
    local_68.pointer = in_stack_00000020;
    if (in_stack_0000002c == 0) {
      in_stack_00000030 = 0x7fffffff;
      local_68.pointer = (WirePointer *)0x0;
    }
    if (in_stack_0000002c == 0) {
      in_stack_00000008 = 0;
      in_stack_0000000c = 0;
      in_stack_00000010 = 0;
      in_stack_00000014 = 0;
    }
    break;
  default:
    goto switchD_001d3fbe_caseD_6;
  case 9:
    bVar3 = in_stack_0000002c == 0;
    local_98.data = in_stack_00000020;
    if (bVar3) {
      local_98.data = (WirePointer *)0x0;
    }
    local_98.pointers._0_4_ = 0x7fffffff;
    if (!bVar3) {
      local_98.pointers._0_4_ = in_stack_00000030;
    }
    local_98.segment._0_4_ = 0;
    local_98.segment._4_4_ = 0;
    local_98.capTable._0_4_ = 0;
    local_98.capTable._4_4_ = 0;
    if (!bVar3) {
      local_98.segment._0_4_ = in_stack_00000008;
      local_98.segment._4_4_ = in_stack_0000000c;
      local_98.capTable._0_4_ = in_stack_00000010;
      local_98.capTable._4_4_ = in_stack_00000014;
    }
    capnp::_::PointerReader::getStruct(&local_48,(PointerReader *)&local_98,(word *)0x0);
    exp_00._reader.capTable._0_4_ = in_stack_00000008;
    exp_00._reader.segment = (SegmentReader *)unaff_retaddr;
    exp_00._reader.capTable._4_4_ = in_stack_0000000c;
    exp_00._reader.data._0_4_ = in_stack_00000010;
    exp_00._reader.data._4_4_ = in_stack_00000014;
    exp_00._reader.pointers = (WirePointer *)in_stack_00000018;
    exp_00._reader._32_8_ = in_stack_00000020;
    exp_00._reader.nestingLimit = in_stack_00000028;
    exp_00._reader._44_2_ = in_stack_0000002c;
    exp_00._reader._46_2_ = in_stack_0000002e;
    AVar4 = (ArrayPtr<const_char>)getExpressionTargetName(exp_00);
    return (StringPtr)AVar4;
  case 10:
    local_68.pointer = in_stack_00000020 + 1;
    if (in_stack_0000002c < 2) {
      in_stack_00000030 = 0x7fffffff;
      in_stack_00000008 = 0;
      in_stack_0000000c = 0;
      in_stack_00000010 = 0;
      in_stack_00000014 = 0;
      local_68.pointer = (WirePointer *)0x0;
    }
  }
  pWVar2 = (WirePointer *)0x0;
  local_68.segment._0_4_ = in_stack_00000008;
  local_68.segment._4_4_ = in_stack_0000000c;
  local_68.capTable._0_4_ = in_stack_00000010;
  local_68.capTable._4_4_ = in_stack_00000014;
  local_68.nestingLimit = in_stack_00000030;
  capnp::_::PointerReader::getStruct(&local_98,&local_68,(word *)0x0);
  local_68.nestingLimit = 0x7fffffff;
  if (local_98.pointerCount != 0) {
    pWVar2 = (WirePointer *)CONCAT44(local_98.pointers._4_4_,(int)local_98.pointers);
    local_68.nestingLimit = local_98.nestingLimit;
  }
  local_68.segment._0_4_ = 0;
  local_68.segment._4_4_ = 0;
  local_68.capTable._0_4_ = 0;
  local_68.capTable._4_4_ = 0;
  if (local_98.pointerCount != 0) {
    local_68.segment._0_4_ = local_98.segment._0_4_;
    local_68.segment._4_4_ = local_98.segment._4_4_;
    local_68.capTable._0_4_ = local_98.capTable._0_4_;
    local_68.capTable._4_4_ = local_98.capTable._4_4_;
  }
  local_68.pointer = pWVar2;
  AVar4 = (ArrayPtr<const_char>)
          capnp::_::PointerReader::getBlob<capnp::Text>(&local_68,(void *)0x0,0);
switchD_001d3fbe_caseD_6:
  return (StringPtr)AVar4;
}

Assistant:

static kj::StringPtr getExpressionTargetName(Expression::Reader exp) {
  kj::StringPtr targetName;
  switch (exp.which()) {
    case Expression::ABSOLUTE_NAME:
      return exp.getAbsoluteName().getValue();
    case Expression::RELATIVE_NAME:
      return exp.getRelativeName().getValue();
    case Expression::APPLICATION:
      return getExpressionTargetName(exp.getApplication().getFunction());
    case Expression::MEMBER:
      return exp.getMember().getName().getValue();
    default:
      return nullptr;
  }
}